

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O1

void clean_up_messaging(void)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  long lVar4;
  
  if (0 < queue_count) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)&queues->owner + lVar3);
      _Var2 = getpid();
      if (iVar1 == _Var2) {
        cgreen_pipe_close(*(int *)((long)&queues->readpipe + lVar3));
        cgreen_pipe_close(*(int *)((long)&queues->writepipe + lVar3));
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < queue_count);
  }
  free(queues);
  queues = (CgreenMessageQueue *)0x0;
  queue_count = 0;
  return;
}

Assistant:

static void clean_up_messaging(void) {
    int i;
    for (i = 0; i < queue_count; i++) {
        if (queues[i].owner == getpid()) {
            cgreen_pipe_close(queues[i].readpipe);
            cgreen_pipe_close(queues[i].writepipe);
        }
    }
    free(queues);
    queues = NULL;
    queue_count = 0;
}